

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O3

bool bc7decomp::unpack_bc7_mode4_5(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  uint8_t uVar1;
  bool bVar2;
  uint32_t bits;
  uint uVar3;
  uint32_t c_2;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  uint32_t total_bits;
  uint uVar7;
  long lVar8;
  undefined4 *puVar9;
  uint uVar10;
  uint32_t c_1;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar15;
  long lVar16;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar17;
  uint32_t i;
  bool bVar18;
  uint32_t weights [16];
  uint local_f8;
  byte local_f4 [8];
  uint local_ec;
  int local_e8 [2];
  color_rgba *local_e0;
  uint8_t local_d8 [32];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_b8 [16];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_78 [3];
  color_rgba endpoints [2];
  uint32_t weight_bits [2];
  color_rgba block_colors [8];
  
  bVar2 = mode != 4;
  uVar7 = 0;
  uVar3 = 0;
  uVar10 = mode + 1;
  if (uVar10 != 0) {
    uVar14 = mode == 4 | 2;
    uVar4 = (uint)bVar2 * 2 + 5;
    uVar3 = 0;
    uVar12 = 0;
    do {
      iVar11 = 8 - (uVar12 & 7);
      if ((int)(uVar10 - uVar3) <= iVar11) {
        iVar11 = uVar10 - uVar3;
      }
      uVar7 = uVar7 | (~(-1 << ((byte)iVar11 & 0x1f)) &
                      (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >>
                            (sbyte)(uVar12 & 7))) << ((byte)uVar3 & 0x1f);
      uVar3 = uVar3 + iVar11;
      uVar12 = iVar11 + uVar12;
    } while (uVar3 < uVar10);
    uVar3 = 0;
    if (uVar7 == 1 << ((byte)mode & 0x1f)) {
      uVar7 = 0;
      do {
        uVar10 = 8 - (uVar12 & 7);
        if (2 - uVar7 <= uVar10) {
          uVar10 = 2 - uVar7;
        }
        uVar3 = uVar3 | (~(-1 << ((byte)uVar10 & 0x1f)) &
                        (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >>
                              (sbyte)(uVar12 & 7))) << ((byte)uVar7 & 0x1f);
        uVar7 = uVar7 + uVar10;
        uVar12 = uVar10 + uVar12;
      } while (uVar7 < 2);
      local_f8 = 0;
      local_e0 = pPixels;
      local_ec = (uint)bVar2 * 2 + 6;
      if (mode == 4) {
        local_f8 = (uint)((*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >> (uVar12 & 7) & 1)
                         != 0);
        uVar12 = uVar12 + 1;
      }
      lVar8 = 0;
      do {
        uVar7 = uVar4;
        if (lVar8 == 3) {
          uVar7 = local_ec;
        }
        lVar16 = 0;
        bVar2 = true;
        do {
          bVar18 = bVar2;
          uVar10 = 0;
          uVar5 = 0;
          do {
            iVar11 = 8 - (uVar12 & 7);
            if ((int)(uVar7 - uVar5) <= iVar11) {
              iVar11 = uVar7 - uVar5;
            }
            uVar10 = uVar10 | (~(-1 << ((byte)iVar11 & 0x1f)) &
                              (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >>
                                    (sbyte)(uVar12 & 7))) << ((byte)uVar5 & 0x1f);
            uVar5 = uVar5 + iVar11;
            uVar12 = iVar11 + uVar12;
          } while (uVar5 < uVar7);
          local_f4[lVar16 * 4 + lVar8] = (byte)uVar10;
          lVar16 = 1;
          bVar2 = false;
        } while (bVar18);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      uVar10 = 2;
      uVar7 = uVar14;
      if (local_f8 == 0) {
        uVar7 = 2;
        uVar10 = uVar14;
      }
      local_e8[1] = uVar10;
      iVar11 = local_e8[local_f8];
      paVar17 = local_b8;
      if (local_f8 == 0) {
        paVar17 = local_78;
      }
      lVar8 = 0;
      do {
        aVar15 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
        uVar14 = iVar11 - (uint)(lVar8 == 0);
        if (uVar14 != 0) {
          uVar5 = 0;
          do {
            iVar13 = 8 - (uVar12 & 7);
            if ((int)(uVar14 - uVar5) <= iVar13) {
              iVar13 = uVar14 - uVar5;
            }
            aVar15.m_comps =
                 aVar15.m_comps |
                 (~(-1 << ((byte)iVar13 & 0x1f)) &
                 (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >> (sbyte)(uVar12 & 7)))
                 << ((byte)uVar5 & 0x1f);
            uVar5 = uVar5 + iVar13;
            uVar12 = uVar12 + iVar13;
          } while (uVar5 < uVar14);
        }
        paVar17[lVar8] = aVar15;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x10);
      iVar11 = local_e8[local_f8 ^ 1];
      paVar17 = local_78;
      if (local_f8 == 0) {
        paVar17 = local_b8;
      }
      lVar8 = 0;
      do {
        aVar15 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
        uVar14 = iVar11 - (uint)(lVar8 == 0);
        if (uVar14 != 0) {
          uVar5 = 0;
          do {
            iVar13 = 8 - (uVar12 & 7);
            if ((int)(uVar14 - uVar5) <= iVar13) {
              iVar13 = uVar14 - uVar5;
            }
            aVar15.m_comps =
                 aVar15.m_comps |
                 (~(-1 << ((byte)iVar13 & 0x1f)) &
                 (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar12 >> 3)) >> (sbyte)(uVar12 & 7)))
                 << ((byte)uVar5 & 0x1f);
            uVar5 = uVar5 + iVar13;
            uVar12 = uVar12 + iVar13;
          } while (uVar5 < uVar14);
        }
        paVar17[lVar8] = aVar15;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x10);
      pbVar6 = local_f4;
      bVar2 = true;
      do {
        bVar18 = bVar2;
        lVar8 = 0;
        do {
          uVar12 = uVar4;
          if (lVar8 == 3) {
            uVar12 = local_ec;
          }
          uVar14 = (uint)pbVar6[lVar8] << (8U - (sbyte)uVar12 & 0x1f);
          pbVar6[lVar8] = (byte)(uVar14 >> (sbyte)uVar12) | (byte)uVar14;
          lVar8 = lVar8 + 1;
        } while (lVar8 != 4);
        uVar12 = 0;
        pbVar6 = local_f4 + 4;
        bVar2 = false;
      } while (bVar18);
      do {
        puVar9 = &g_bc7_weights3;
        if (uVar7 == 2) {
          puVar9 = &g_bc7_weights2;
        }
        iVar11 = puVar9[uVar12];
        lVar8 = 0;
        do {
          local_b8[0].m_comps[lVar8 + (ulong)uVar12 * 4 + -0x20] =
               (uint8_t)((uint)local_f4[lVar8] * (0x40 - iVar11) +
                         (uint)local_f4[lVar8 + 4] * iVar11 + 0x20 >> 6);
          lVar8 = lVar8 + 1;
        } while (lVar8 != 3);
        uVar12 = uVar12 + 1;
      } while (uVar12 >> (sbyte)uVar7 == 0);
      uVar7 = 1;
      do {
        puVar9 = &g_bc7_weights3;
        if (uVar10 == 2) {
          puVar9 = &g_bc7_weights2;
        }
        local_b8[0].m_comps[(ulong)(uVar7 - 1) * 4 + -0x1d] =
             (uint8_t)((0x40 - puVar9[uVar7 - 1]) * (uint)local_f4[3] +
                       puVar9[uVar7 - 1] * (uint)local_f4[7] + 0x20 >> 6);
        uVar4 = uVar7 >> (sbyte)uVar10;
        uVar7 = uVar7 + 1;
      } while (uVar4 == 0);
      lVar8 = 0;
      do {
        local_e0[lVar8].field_0 = local_b8[(ulong)(uint)local_78[lVar8] - 8];
        uVar1 = local_b8[0].m_comps[(ulong)(uint)local_b8[lVar8] * 4 + -0x1d];
        local_e0[lVar8].field_0.m_comps[3] = uVar1;
        if (uVar3 != 0) {
          local_e0[lVar8].field_0.m_comps[3] = local_e0[lVar8].field_0.m_comps[uVar3 - 1];
          local_e0[lVar8].field_0.m_comps[uVar3 - 1] = uVar1;
        }
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x10);
      uVar3 = 1;
    }
  }
  return SUB41(uVar3,0);
}

Assistant:

bool unpack_bc7_mode4_5(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
{
	const uint32_t ENDPOINTS = 2;
	const uint32_t COMPS = 4;
	const uint32_t WEIGHT_BITS = 2;
	const uint32_t A_WEIGHT_BITS = (mode == 4) ? 3 : 2;
	const uint32_t ENDPOINT_BITS = (mode == 4) ? 5 : 7;
	const uint32_t A_ENDPOINT_BITS = (mode == 4) ? 6 : 8;
	//const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
	//const uint32_t A_WEIGHT_VALS = 1 << A_WEIGHT_BITS;

	uint32_t bit_offset = 0;
	const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

	if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

	const uint32_t comp_rot = read_bits32(pBuf, bit_offset, 2);
	const uint32_t index_mode = (mode == 4) ? read_bits32(pBuf, bit_offset, 1) : 0;

	color_rgba endpoints[ENDPOINTS];
	for (uint32_t c = 0; c < COMPS; c++)
		for (uint32_t e = 0; e < ENDPOINTS; e++)
			endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, (c == 3) ? A_ENDPOINT_BITS : ENDPOINT_BITS);
		
	const uint32_t weight_bits[2] = { index_mode ? A_WEIGHT_BITS : WEIGHT_BITS,  index_mode ? WEIGHT_BITS : A_WEIGHT_BITS };
		
	uint32_t weights[16], a_weights[16];
		
	for (uint32_t i = 0; i < 16; i++)
		(index_mode ? a_weights : weights)[i] = read_bits32(pBuf, bit_offset, weight_bits[index_mode] - ((!i) ? 1 : 0));

	for (uint32_t i = 0; i < 16; i++)
		(index_mode ? weights : a_weights)[i] = read_bits32(pBuf, bit_offset, weight_bits[1 - index_mode] - ((!i) ? 1 : 0));

	assert(bit_offset == 128);

	for (uint32_t e = 0; e < ENDPOINTS; e++)
		for (uint32_t c = 0; c < 4; c++)
			endpoints[e][c] = (uint8_t)bc7_dequant(endpoints[e][c], (c == 3) ? A_ENDPOINT_BITS : ENDPOINT_BITS);

	color_rgba block_colors[8];
	for (uint32_t i = 0; i < (1U << weight_bits[0]); i++)
		for (uint32_t c = 0; c < 3; c++)
			block_colors[i][c] = (uint8_t)bc7_interp(endpoints[0][c], endpoints[1][c], i, weight_bits[0]);

	for (uint32_t i = 0; i < (1U << weight_bits[1]); i++)
		block_colors[i][3] = (uint8_t)bc7_interp(endpoints[0][3], endpoints[1][3], i, weight_bits[1]);

	for (uint32_t i = 0; i < 16; i++)
	{
		pPixels[i] = block_colors[weights[i]];
		pPixels[i].a = block_colors[a_weights[i]].a;
		if (comp_rot >= 1)
			std::swap(pPixels[i].a, pPixels[i].m_comps[comp_rot - 1]);
	}

	return true;
}